

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall duckdb::UnnestInit(duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::UnnestGlobalState_*,_false> _Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  FunctionData *pFVar4;
  LogicalType *args;
  pointer pBVar5;
  pointer pUVar6;
  _Head_base<0UL,_duckdb::BoundUnnestExpression_*,_false> local_30;
  _Head_base<0UL,_duckdb::UnnestGlobalState_*,_false> local_28;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_18;
  
  pFVar4 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&input->bind_data);
  make_uniq<duckdb::UnnestGlobalState>();
  local_30._M_head_impl = (BoundUnnestExpression *)((ulong)local_30._M_head_impl._4_4_ << 0x20);
  make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_int>
            ((duckdb *)&local_20,(LogicalType *)(pFVar4 + 1),(uint *)&local_30);
  args = ListType::GetChildType((LogicalType *)(pFVar4 + 1));
  make_uniq<duckdb::BoundUnnestExpression,duckdb::LogicalType_const&>((duckdb *)&local_30,args);
  _Var3._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (Expression *)0x0;
  pBVar5 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                         *)&local_30);
  _Var1._M_head_impl =
       (pBVar5->child).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar5->child).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  pUVar6 = unique_ptr<duckdb::UnnestGlobalState,_std::default_delete<duckdb::UnnestGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::UnnestGlobalState,_std::default_delete<duckdb::UnnestGlobalState>,_true>
                         *)&local_28);
  local_18._M_head_impl = &(local_30._M_head_impl)->super_Expression;
  local_30._M_head_impl = (BoundUnnestExpression *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&pUVar6->select_list,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_18);
  if ((BoundUnnestExpression *)local_18._M_head_impl != (BoundUnnestExpression *)0x0) {
    (*(((Expression *)&(local_18._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (UnnestGlobalState *)0x0;
  *(UnnestGlobalState **)this = _Var2._M_head_impl;
  if (local_30._M_head_impl != (BoundUnnestExpression *)0x0) {
    (*((local_30._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  if (local_20._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  if (local_28._M_head_impl != (UnnestGlobalState *)0x0) {
    (*((local_28._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])()
    ;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this;
}

Assistant:

static unique_ptr<GlobalTableFunctionState> UnnestInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<UnnestBindData>();
	auto result = make_uniq<UnnestGlobalState>();
	auto ref = make_uniq<BoundReferenceExpression>(bind_data.input_type, 0U);
	auto bound_unnest = make_uniq<BoundUnnestExpression>(ListType::GetChildType(bind_data.input_type));
	bound_unnest->child = std::move(ref);
	result->select_list.push_back(std::move(bound_unnest));
	return std::move(result);
}